

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# storage.hpp
# Opt level: O1

void __thiscall diy::FileStorage::destroy(FileStorage *this,int i)

{
  CriticalMap *this_00;
  size_t sVar1;
  mapped_type *pmVar2;
  pair<std::_Rb_tree_iterator<std::pair<const_int,_diy::FileStorage::FileRecord>_>,_std::_Rb_tree_iterator<std::pair<const_int,_diy::FileStorage::FileRecord>_>_>
  pVar3;
  CriticalMapAccessor accessor;
  FileRecord fr;
  int local_5c;
  CriticalMap *local_58;
  unique_lock<tthread::fast_mutex> local_50;
  size_t local_40;
  char *local_38;
  undefined8 local_30;
  char local_28;
  undefined7 uStack_27;
  
  local_30 = 0;
  local_28 = '\0';
  local_58 = &this->filenames_;
  local_50._M_device = &(this->filenames_).m_;
  local_50._M_owns = false;
  local_5c = i;
  local_38 = &local_28;
  std::unique_lock<tthread::fast_mutex>::lock(&local_50);
  local_50._M_owns = true;
  pmVar2 = std::
           map<int,_diy::FileStorage::FileRecord,_std::less<int>,_std::allocator<std::pair<const_int,_diy::FileStorage::FileRecord>_>_>
           ::operator[](&local_58->x_,&local_5c);
  local_40 = pmVar2->size;
  std::__cxx11::string::_M_assign((string *)&local_38);
  this_00 = local_58;
  pVar3 = std::
          _Rb_tree<int,_std::pair<const_int,_diy::FileStorage::FileRecord>,_std::_Select1st<std::pair<const_int,_diy::FileStorage::FileRecord>_>,_std::less<int>,_std::allocator<std::pair<const_int,_diy::FileStorage::FileRecord>_>_>
          ::equal_range((_Rb_tree<int,_std::pair<const_int,_diy::FileStorage::FileRecord>,_std::_Select1st<std::pair<const_int,_diy::FileStorage::FileRecord>_>,_std::less<int>,_std::allocator<std::pair<const_int,_diy::FileStorage::FileRecord>_>_>
                         *)local_58,&local_5c);
  std::
  _Rb_tree<int,_std::pair<const_int,_diy::FileStorage::FileRecord>,_std::_Select1st<std::pair<const_int,_diy::FileStorage::FileRecord>_>,_std::less<int>,_std::allocator<std::pair<const_int,_diy::FileStorage::FileRecord>_>_>
  ::_M_erase_aux((_Rb_tree<int,_std::pair<const_int,_diy::FileStorage::FileRecord>,_std::_Select1st<std::pair<const_int,_diy::FileStorage::FileRecord>_>,_std::less<int>,_std::allocator<std::pair<const_int,_diy::FileStorage::FileRecord>_>_>
                  *)this_00,(_Base_ptr)pVar3.first._M_node,(_Base_ptr)pVar3.second._M_node);
  if ((local_50._M_owns == true) && (local_50._M_device != (fast_mutex *)0x0)) {
    LOCK();
    (local_50._M_device)->mLock = 0;
    UNLOCK();
    local_50._M_owns = false;
  }
  remove(local_38);
  sVar1 = local_40;
  local_58 = (CriticalMap *)&this->current_size_;
  local_50._M_device = &(this->current_size_).m_;
  local_50._M_owns = false;
  std::unique_lock<tthread::fast_mutex>::lock(&local_50);
  *(unsigned_long *)&local_58->x_ = *(unsigned_long *)&local_58->x_ - sVar1;
  if (local_50._M_device != (fast_mutex *)0x0) {
    LOCK();
    (local_50._M_device)->mLock = 0;
    UNLOCK();
  }
  local_50._M_owns = local_50._M_device == (fast_mutex *)0x0;
  if (local_38 != &local_28) {
    operator_delete(local_38,CONCAT71(uStack_27,local_28) + 1);
  }
  return;
}

Assistant:

virtual void  destroy(int i) override
      {
        FileRecord      fr;
        {
          CriticalMapAccessor accessor = filenames_.access();
          fr = (*accessor)[i];
          accessor->erase(i);
        }
        io::utils::remove(fr.name);
        (*current_size_.access()) -= fr.size;
      }